

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<kratos::Simulator&,kratos::Var*,std::optional<long>>::
load_impl_sequence<0ul,1ul,2ul>
          (argument_loader<kratos::Simulator&,kratos::Var*,std::optional<long>> *this,long call)

{
  handle src;
  bool bVar1;
  type_caster<long,_void> local_20;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x28),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if (((!bVar1) ||
      (bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                         ((type_caster_generic *)(this + 0x10),
                          *(PyObject **)(*(long *)(call + 8) + 8),
                          SUB41((**(uint **)(call + 0x20) & 2) >> 1,0)), !bVar1)) ||
     (src.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10), src.m_ptr == (PyObject *)0x0)) {
    return false;
  }
  if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
    return true;
  }
  bVar1 = type_caster<long,_void>::load
                    (&local_20,src,SUB41(((uint)**(undefined8 **)(call + 0x20) & 4) >> 2,0));
  if (!bVar1) {
    return bVar1;
  }
  *(long *)this = local_20.value;
  this[8] = (argument_loader<kratos::Simulator&,kratos::Var*,std::optional<long>>)0x1;
  return bVar1;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }